

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  char *test_case_name;
  ostream *poVar1;
  TestInfo *pTVar2;
  TimeInMillis ms;
  TestResult *result;
  int i;
  int i_00;
  undefined1 local_90 [8];
  string kTestsuite;
  string local_50;
  int local_30;
  allocator local_29;
  
  std::__cxx11::string::string((string *)local_90,"testsuite",(allocator *)&local_50);
  poVar1 = std::operator<<(stream,"  <");
  std::operator<<(poVar1,(string *)local_90);
  std::__cxx11::string::string((string *)&local_50,"name",(allocator *)&local_30);
  std::__cxx11::string::string
            ((string *)(kTestsuite.field_2._M_local_buf + 8),(test_case->name_)._M_dataplus._M_p,
             &local_29);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"tests",&local_29);
  local_30 = TestCase::reportable_test_count(test_case);
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"failures",&local_29);
  local_30 = TestCase::failed_test_count(test_case);
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"disabled",&local_29);
  local_30 = TestCase::reportable_disabled_test_count(test_case);
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"errors",(allocator *)&local_30);
  std::__cxx11::string::string((string *)(kTestsuite.field_2._M_local_buf + 8),"0",&local_29);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"time",(allocator *)&local_30);
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_case->elapsed_time_,ms);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_50,(XmlUnitTestResultPrinter *)&test_case->ad_hoc_test_result_,result);
  poVar1 = std::operator<<(stream,(string *)&local_50);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&local_50);
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(test_case->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(test_case->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar2 = TestCase::GetTestInfo(test_case,i_00);
    if (pTVar2->matches_filter_ == true) {
      test_case_name = (test_case->name_)._M_dataplus._M_p;
      pTVar2 = TestCase::GetTestInfo(test_case,i_00);
      OutputXmlTestInfo(stream,test_case_name,pTVar2);
    }
  }
  poVar1 = std::operator<<(stream,"  </");
  poVar1 = std::operator<<(poVar1,(string *)local_90);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "failures",
                     StreamableToString(test_case.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuite, "disabled",
      StreamableToString(test_case.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "errors", "0");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
  *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result())
          << ">\n";

  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}